

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::NodeRef::set_val(NodeRef *this,csubstr val)

{
  pfn_error p_Var1;
  Location LVar2;
  Location loc;
  bool bVar3;
  error_flags eVar4;
  NodeRef *in_RDI;
  char msg [43];
  size_t in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  Location *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  Location *in_stack_ffffffffffffff30;
  char (*in_stack_ffffffffffffff60) [32];
  undefined8 uStack_98;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  type_bits in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  Tree *in_stack_ffffffffffffff90;
  csubstr in_stack_ffffffffffffff98;
  size_t sStack_38;
  char *local_30;
  Location *pLStack_28;
  char *local_20;
  
  if (in_RDI->m_tree == (Tree *)0x0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
                       ,in_stack_ffffffffffffff08);
    loc.super_LineCol.line = in_stack_ffffffffffffff78;
    loc.super_LineCol.offset = in_stack_ffffffffffffff70;
    loc.super_LineCol.col = in_stack_ffffffffffffff80;
    loc.name.str = (char *)in_stack_ffffffffffffff88;
    loc.name.len = (size_t)in_stack_ffffffffffffff90;
    error<32ul>(in_stack_ffffffffffffff60,loc);
    in_stack_ffffffffffffff10 = sStack_38;
    in_stack_ffffffffffffff18 = local_30;
    in_stack_ffffffffffffff20 = pLStack_28;
    in_stack_ffffffffffffff28 = local_20;
  }
  if ((in_RDI->m_id == 0xffffffffffffffff) || (bVar3 = is_seed(in_RDI), bVar3)) {
    memcpy(&stack0xffffffffffffff88,"check failed: (m_id != NONE && !is_seed())",0x2b);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_tree->m_callbacks).m_error;
    Location::Location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (size_t)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18,
                       in_stack_ffffffffffffff10);
    LVar2.super_LineCol.line = uStack_98;
    LVar2.super_LineCol.offset = (size_t)in_stack_ffffffffffffff60;
    LVar2.super_LineCol.col = in_stack_ffffffffffffff70;
    LVar2.name.str = (char *)in_stack_ffffffffffffff78;
    LVar2.name.len = in_stack_ffffffffffffff80;
    (*p_Var1)(&stack0xffffffffffffff88,0x2b,LVar2,(in_RDI->m_tree->m_callbacks).m_user_data);
  }
  Tree::_set_val(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff80);
  return;
}

Assistant:

void set_val(csubstr val) { _C4RV(); m_tree->_set_val(m_id, val); }